

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void BotTest<generic_bots::MinimaxBot<ttt::Board,minimax::ABeta<ttt::Board,minimax::Eval<ttt::Board>>>,ttt::Board>
               (void)

{
  ostream *poVar1;
  rep millis;
  time_point t2;
  IMove m;
  time_point t1;
  MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> bot;
  int i;
  Board game;
  ostream *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  Board *in_stack_ffffffffffffff58;
  MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>
  *in_stack_ffffffffffffff60;
  type in_stack_ffffffffffffff80;
  duration<long,_std::ratio<1L,_1000L>_> local_60;
  rep local_58;
  undefined8 local_50;
  IMove local_38;
  undefined8 local_30;
  int local_10;
  
  ttt::Board::Board((Board *)in_stack_ffffffffffffff60);
  for (local_10 = 1; local_10 < 0xd; local_10 = local_10 + 1) {
    generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::
    MinimaxBot(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    local_30 = std::chrono::_V2::system_clock::now();
    local_38 = generic_bots::
               MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::
               MakeMove((MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>
                         *)in_stack_ffffffffffffff80.__r);
    local_50 = std::chrono::_V2::system_clock::now();
    in_stack_ffffffffffffff80 =
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_ffffffffffffff58,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_ffffffffffffff50);
    local_60.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   in_stack_ffffffffffffff48);
    local_58 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_60);
    poVar1 = std::operator<<((ostream *)&std::cout,"Depth: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    in_stack_ffffffffffffff60 =
         (MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *)
         std::operator<<(poVar1," in ");
    in_stack_ffffffffffffff58 =
         (Board *)std::ostream::operator<<((ostream *)in_stack_ffffffffffffff60,local_58);
    std::operator<<((ostream *)in_stack_ffffffffffffff58," milliseconds\n");
    in_stack_ffffffffffffff50 = std::operator<<((ostream *)&std::cout,"Move: ");
    in_stack_ffffffffffffff48 =
         (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff50,local_38);
    std::operator<<(in_stack_ffffffffffffff48,'\n');
    generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::
    ~MinimaxBot((MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *)
                0x1f8822);
  }
  return;
}

Assistant:

void
BotTest()
{
    IGame game;
    for (int i = 1; i < 13; ++i)
    {
        IBot bot(&game, i);
        auto t1 = std::chrono::high_resolution_clock::now();
        auto m = bot.MakeMove();
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Depth: " << i << " in " << millis << " milliseconds\n";
        std::cout << "Move: " << m << '\n';
    }
}